

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# index.cpp
# Opt level: O2

void IndexWaitSynced(BaseIndex *index,SignalInterrupt *interrupt)

{
  bool bVar1;
  long in_FS_OFFSET;
  IndexSummary local_80;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  while( true ) {
    bVar1 = BaseIndex::BlockUntilSyncedToCurrentChain(index);
    if (bVar1) break;
    bVar1 = util::SignalInterrupt::operator_cast_to_bool(interrupt);
    local_80.name._M_dataplus._M_p._0_1_ = !bVar1;
    inline_assertion_check<true,bool>
              ((bool *)&local_80,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/util/index.cpp"
               ,0x11,"IndexWaitSynced","!interrupt");
    local_80.name._M_dataplus._M_p = (pointer)0x186a0;
    UninterruptibleSleep((microseconds *)&local_80);
  }
  BaseIndex::GetSummary(&local_80,index);
  if (local_80.synced != false) {
    std::__cxx11::string::~string((string *)&local_80);
    if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
      return;
    }
    __stack_chk_fail();
  }
  __assert_fail("index.GetSummary().synced",
                "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/util/index.cpp"
                ,0x15,"void IndexWaitSynced(const BaseIndex &, const util::SignalInterrupt &)");
}

Assistant:

void IndexWaitSynced(const BaseIndex& index, const util::SignalInterrupt& interrupt)
{
    while (!index.BlockUntilSyncedToCurrentChain()) {
        // Assert shutdown was not requested to abort the test, instead of looping forever, in case
        // there was an unexpected error in the index that caused it to stop syncing and request a shutdown.
        Assert(!interrupt);

        UninterruptibleSleep(100ms);
    }
    assert(index.GetSummary().synced);
}